

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-a32.inc.c
# Opt level: O0

void disas_a32_extract_ldst_rr_pw0(DisasContext_conflict1 *ctx,arg_ldst_rr *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t insn_local;
  arg_ldst_rr *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x17,1);
  a->u = uVar1;
  uVar1 = extract32(insn,0x10,4);
  a->rn = uVar1;
  uVar1 = extract32(insn,0xc,4);
  a->rt = uVar1;
  uVar1 = extract32(insn,0,4);
  a->rm = uVar1;
  a->p = 0;
  a->w = 0;
  a->shimm = 0;
  a->shtype = 0;
  return;
}

Assistant:

static void disas_a32_extract_ldst_rr_pw0(DisasContext *ctx, arg_ldst_rr *a, uint32_t insn)
{
    a->u = extract32(insn, 23, 1);
    a->rn = extract32(insn, 16, 4);
    a->rt = extract32(insn, 12, 4);
    a->rm = extract32(insn, 0, 4);
    a->p = 0;
    a->w = 0;
    a->shimm = 0;
    a->shtype = 0;
}